

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.cc
# Opt level: O2

void __thiscall iqxmlrpc::http::Header::parse(Header *this,string *s)

{
  Malformed_packet *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Input;
  iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  iVar2;
  locale local_f0;
  _Map_pointer local_e8;
  Header *local_e0;
  string opt_name;
  string opt_value;
  is_any_ofF<char> local_98;
  Tokens lines;
  
  local_e0 = this;
  std::
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_Deque_base(&lines.
                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               );
  boost::algorithm::is_any_of<char[3]>(&local_98,(char (*) [3])&names::crlf);
  boost::algorithm::
  split<std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string_const&,boost::algorithm::detail::is_any_ofF<char>>
            (&lines,s,&local_98,token_compress_on);
  boost::algorithm::detail::is_any_ofF<char>::~is_any_ofF(&local_98);
  Input = lines.
          super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_cur;
  if (lines.
      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      lines.
      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    std::__cxx11::string::_M_assign((string *)&local_e0->head_line_);
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_front(&lines);
    Input = lines.
            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur;
  }
  local_e8 = lines.
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_node;
  pbVar1 = lines.
           super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_last;
  while( true ) {
    if (Input == lines.
                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur) {
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~deque(&lines);
      return;
    }
    iVar2 = boost::algorithm::find_first<std::__cxx11::string,char[2]>(Input,(char (*) [2])":");
    if (iVar2.
        super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
        .
        super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
        .
        super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
        .m_Begin._M_current == (Input->_M_dataplus)._M_p + Input->_M_string_length) break;
    opt_name._M_dataplus._M_p = (pointer)&opt_name.field_2;
    opt_name._M_string_length = 0;
    opt_value._M_dataplus._M_p = (pointer)&opt_value.field_2;
    opt_value._M_string_length = 0;
    opt_name.field_2._M_local_buf[0] = '\0';
    opt_value.field_2._M_local_buf[0] = '\0';
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<char*,std::back_insert_iterator<std::__cxx11::string>>
              ((Input->_M_dataplus)._M_p,
               iVar2.
               super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
               .
               super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
               .
               super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
               .m_Begin._M_current,&opt_name);
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<char*,std::back_insert_iterator<std::__cxx11::string>>
              (iVar2.
               super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
               .
               super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
               .
               super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
               .m_End._M_current,(Input->_M_dataplus)._M_p + Input->_M_string_length,&opt_value);
    std::locale::locale(&local_f0);
    boost::algorithm::trim<std::__cxx11::string>(&opt_name,&local_f0);
    std::locale::~locale(&local_f0);
    std::locale::locale(&local_f0);
    boost::algorithm::trim<std::__cxx11::string>(&opt_value,&local_f0);
    std::locale::~locale(&local_f0);
    std::locale::locale(&local_f0);
    boost::algorithm::to_lower<std::__cxx11::string>(&opt_name,&local_f0);
    std::locale::~locale(&local_f0);
    set_option_checked(local_e0,&opt_name,&opt_value);
    std::__cxx11::string::~string((string *)&opt_value);
    std::__cxx11::string::~string((string *)&opt_name);
    Input = Input + 1;
    if (Input == pbVar1) {
      Input = local_e8[1];
      local_e8 = local_e8 + 1;
      pbVar1 = Input + 0x10;
    }
  }
  this_00 = (Malformed_packet *)__cxa_allocate_exception(0x18);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&opt_name,"option line does not contain a colon symbol",
             (allocator<char> *)&opt_value);
  Malformed_packet::Malformed_packet(this_00,&opt_name);
  __cxa_throw(this_00,&Malformed_packet::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Header::parse(const std::string& s)
{
  typedef std::deque<std::string> Tokens;
  Tokens lines;
  boost::split(lines, s, boost::is_any_of(names::crlf), boost::token_compress_on);

  if (!lines.empty()) {
    head_line_ = lines.front();
    lines.pop_front();
  }

  for (Tokens::iterator i = lines.begin(); i != lines.end(); ++i) {
    boost::iterator_range<std::string::iterator> j = boost::find_first(*i, ":");
    if (j.begin() == i->end())
      throw Malformed_packet("option line does not contain a colon symbol");

    std::string opt_name, opt_value;
    std::copy(i->begin(), j.begin(), std::back_inserter(opt_name));
    std::copy(j.end(), i->end(), std::back_inserter(opt_value));

    boost::trim(opt_name);
    boost::trim(opt_value);
    boost::to_lower(opt_name);
    set_option_checked(opt_name, opt_value);
  }
}